

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  undefined4 extraout_var;
  undefined **ppuVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLElement *pXVar5;
  
  iVar2 = this->_parseCurLineNum;
  __s1 = XMLUtil::SkipWhiteSpace(p,&this->_parseCurLineNum);
  cVar1 = *__s1;
  if (cVar1 == '\0') {
    pXVar5 = (XMLElement *)0x0;
    goto LAB_0021abb9;
  }
  if ((__s1 == "<?") || ((cVar1 == '<' && (__s1[1] == '?')))) {
    iVar2 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
    pXVar5 = (XMLElement *)CONCAT44(extraout_var,iVar2);
    (pXVar5->super_XMLNode)._document = this;
    (pXVar5->super_XMLNode)._parent = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._value._flags = 0;
    (pXVar5->super_XMLNode)._value._start = (char *)0x0;
    (pXVar5->super_XMLNode)._value._end = (char *)0x0;
    (pXVar5->super_XMLNode)._parseLineNum = 0;
    (pXVar5->super_XMLNode)._firstChild = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._lastChild = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._prev = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._next = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._userData = (void *)0x0;
    ppuVar4 = &PTR_ToElement_0027b760;
LAB_0021a958:
    (pXVar5->super_XMLNode)._vptr_XMLNode = (_func_int **)ppuVar4;
    (pXVar5->super_XMLNode)._memPool = &(this->_commentPool).super_MemPool;
    DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
    iVar2 = (this->_unlinked)._size;
    (this->_unlinked)._mem[iVar2] = &pXVar5->super_XMLNode;
    (this->_unlinked)._size = iVar2 + 1;
    (pXVar5->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
    __s1 = __s1 + 2;
  }
  else {
    if (__s1 != "<!--") {
      iVar3 = strncmp(__s1,"<!--",4);
      if (iVar3 != 0) {
        if (__s1 != "<![CDATA[") {
          iVar3 = strncmp(__s1,"<![CDATA[",9);
          if (iVar3 != 0) {
            if (__s1 != "<!") {
              if (cVar1 == '<') {
                if (__s1[1] == '!') goto LAB_0021aa28;
              }
              else if (__s1 != "<") {
                pXVar5 = (XMLElement *)
                         CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
                (pXVar5->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
                this->_parseCurLineNum = iVar2;
                __s1 = p;
                goto LAB_0021abb9;
              }
              pXVar5 = CreateUnlinkedNode<tinyxml2::XMLElement,120>(this,&this->_elementPool);
              (pXVar5->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
              __s1 = __s1 + 1;
              goto LAB_0021abb9;
            }
LAB_0021aa28:
            iVar2 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
            pXVar5 = (XMLElement *)CONCAT44(extraout_var_00,iVar2);
            (pXVar5->super_XMLNode)._document = this;
            (pXVar5->super_XMLNode)._parent = (XMLNode *)0x0;
            (pXVar5->super_XMLNode)._value._flags = 0;
            (pXVar5->super_XMLNode)._value._start = (char *)0x0;
            (pXVar5->super_XMLNode)._value._end = (char *)0x0;
            (pXVar5->super_XMLNode)._parseLineNum = 0;
            (pXVar5->super_XMLNode)._firstChild = (XMLNode *)0x0;
            (pXVar5->super_XMLNode)._lastChild = (XMLNode *)0x0;
            (pXVar5->super_XMLNode)._prev = (XMLNode *)0x0;
            (pXVar5->super_XMLNode)._next = (XMLNode *)0x0;
            (pXVar5->super_XMLNode)._userData = (void *)0x0;
            ppuVar4 = &PTR_ToElement_0027b800;
            goto LAB_0021a958;
          }
        }
        iVar2 = (*(this->_textPool).super_MemPool._vptr_MemPool[3])(&this->_textPool);
        pXVar5 = (XMLElement *)CONCAT44(extraout_var_02,iVar2);
        (pXVar5->super_XMLNode)._document = this;
        (pXVar5->super_XMLNode)._parent = (XMLNode *)0x0;
        (pXVar5->super_XMLNode)._value._flags = 0;
        (pXVar5->super_XMLNode)._value._start = (char *)0x0;
        (pXVar5->super_XMLNode)._value._end = (char *)0x0;
        (pXVar5->super_XMLNode)._parseLineNum = 0;
        (pXVar5->super_XMLNode)._firstChild = (XMLNode *)0x0;
        (pXVar5->super_XMLNode)._lastChild = (XMLNode *)0x0;
        (pXVar5->super_XMLNode)._prev = (XMLNode *)0x0;
        (pXVar5->super_XMLNode)._next = (XMLNode *)0x0;
        (pXVar5->super_XMLNode)._userData = (void *)0x0;
        (pXVar5->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_0027ba58;
        *(bool *)&pXVar5->_closingType = false;
        (pXVar5->super_XMLNode)._memPool = &(this->_textPool).super_MemPool;
        DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity
                  (&this->_unlinked,(this->_unlinked)._size + 1);
        iVar2 = (this->_unlinked)._size;
        (this->_unlinked)._mem[iVar2] = (XMLNode *)pXVar5;
        (this->_unlinked)._size = iVar2 + 1;
        (pXVar5->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
        __s1 = __s1 + 9;
        *(bool *)&pXVar5->_closingType = true;
        goto LAB_0021abb9;
      }
    }
    iVar2 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
    pXVar5 = (XMLElement *)CONCAT44(extraout_var_01,iVar2);
    (pXVar5->super_XMLNode)._document = this;
    (pXVar5->super_XMLNode)._parent = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._value._flags = 0;
    (pXVar5->super_XMLNode)._value._start = (char *)0x0;
    (pXVar5->super_XMLNode)._value._end = (char *)0x0;
    (pXVar5->super_XMLNode)._parseLineNum = 0;
    (pXVar5->super_XMLNode)._firstChild = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._lastChild = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._prev = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._next = (XMLNode *)0x0;
    (pXVar5->super_XMLNode)._userData = (void *)0x0;
    (pXVar5->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_0027b6c0;
    (pXVar5->super_XMLNode)._memPool = &(this->_commentPool).super_MemPool;
    DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
    iVar2 = (this->_unlinked)._size;
    (this->_unlinked)._mem[iVar2] = (XMLNode *)pXVar5;
    (this->_unlinked)._size = iVar2 + 1;
    (pXVar5->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
    __s1 = __s1 + 4;
  }
LAB_0021abb9:
  *node = &pXVar5->super_XMLNode;
  return __s1;
}

Assistant:

char* XMLDocument::Identify( char* p, XMLNode** node )
{
    TIXMLASSERT( node );
    TIXMLASSERT( p );
    char* const start = p;
    int const startLine = _parseCurLineNum;
    p = XMLUtil::SkipWhiteSpace( p, &_parseCurLineNum );
    if( !*p ) {
        *node = 0;
        TIXMLASSERT( p );
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader		= { "<?" };
    static const char* commentHeader	= { "<!--" };
    static const char* cdataHeader		= { "<![CDATA[" };
    static const char* dtdHeader		= { "<!" };
    static const char* elementHeader	= { "<" };	// and a header for everything else; check last.

    static const int xmlHeaderLen		= 2;
    static const int commentHeaderLen	= 4;
    static const int cdataHeaderLen		= 9;
    static const int dtdHeaderLen		= 2;
    static const int elementHeaderLen	= 1;

    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLUnknown ) );		// use same memory pool
    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLDeclaration ) );	// use same memory pool
    XMLNode* returnNode = 0;
    if ( XMLUtil::StringEqual( p, xmlHeader, xmlHeaderLen ) ) {
        returnNode = CreateUnlinkedNode<XMLDeclaration>( _commentPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += xmlHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, commentHeader, commentHeaderLen ) ) {
        returnNode = CreateUnlinkedNode<XMLComment>( _commentPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += commentHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, cdataHeader, cdataHeaderLen ) ) {
        XMLText* text = CreateUnlinkedNode<XMLText>( _textPool );
        returnNode = text;
        returnNode->_parseLineNum = _parseCurLineNum;
        p += cdataHeaderLen;
        text->SetCData( true );
    }
    else if ( XMLUtil::StringEqual( p, dtdHeader, dtdHeaderLen ) ) {
        returnNode = CreateUnlinkedNode<XMLUnknown>( _commentPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += dtdHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, elementHeader, elementHeaderLen ) ) {
        returnNode =  CreateUnlinkedNode<XMLElement>( _elementPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += elementHeaderLen;
    }
    else {
        returnNode = CreateUnlinkedNode<XMLText>( _textPool );
        returnNode->_parseLineNum = _parseCurLineNum; // Report line of first non-whitespace character
        p = start;	// Back it up, all the text counts.
        _parseCurLineNum = startLine;
    }

    TIXMLASSERT( returnNode );
    TIXMLASSERT( p );
    *node = returnNode;
    return p;
}